

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O1

cmd_params * parse_cmd_params(cmd_params *__return_storage_ptr__,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  _Bit_iterator __last_01;
  _Bit_iterator __last_02;
  _Bit_iterator __last_03;
  _Bvector_impl *p_Var13;
  undefined8 uVar14;
  output_formats oVar15;
  char *pcVar16;
  pointer pbVar17;
  pointer pbVar18;
  undefined8 uVar19;
  char cVar20;
  bool bVar21;
  int iVar22;
  flag_type fVar23;
  ggml_sched_priority gVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  size_type __n;
  ulong uVar28;
  char **ppcVar29;
  char separator;
  char delim;
  char delim_00;
  char delim_01;
  char separator_00;
  char delim_02;
  char separator_01;
  char separator_02;
  char delim_03;
  char separator_03;
  char delim_04;
  char delim_05;
  char delim_06;
  char separator_04;
  char delim_07;
  char delim_08;
  char delim_09;
  char delim_10;
  char delim_11;
  char separator_05;
  char *pcVar30;
  int iVar31;
  output_formats *format;
  long lVar32;
  ggml_numa_strategy gVar33;
  pointer pbVar34;
  size_t i;
  string *psVar35;
  float fVar36;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  const_iterator __position_02;
  const_iterator __position_03;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __first_01;
  _Bit_iterator __first_02;
  _Bit_iterator __first_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts;
  sregex_token_iterator it;
  regex regex;
  string arg;
  vector<float,_std::allocator<float>_> tensor_split;
  string arg_prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_arg;
  char **local_3c8;
  undefined1 local_3b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  long local_378;
  string *local_308;
  int local_2fc;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2f8;
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 local_2c8;
  undefined7 uStack_2c7;
  allocator_type local_2b1;
  vector<float,_std::allocator<float>_> local_2b0;
  long *local_298;
  string *local_290;
  long local_288 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  output_formats *local_260;
  output_formats *local_258;
  vector<bool,std::allocator<bool>> *local_250;
  vector<bool,std::allocator<bool>> *local_248;
  vector<bool,std::allocator<bool>> *local_240;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_238;
  vector<bool,std::allocator<bool>> *local_230;
  vector<int,_std::allocator<int>_> *local_228;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_220;
  vector<llama_split_mode,std::allocator<llama_split_mode>> *local_218;
  vector<int,std::allocator<int>> *local_210;
  vector<int,std::allocator<int>> *local_208;
  vector<bool,std::allocator<bool>> *local_200;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1f8;
  vector<int,std::allocator<int>> *local_1f0;
  vector<ggml_type,std::allocator<ggml_type>> *local_1e8;
  vector<ggml_type,std::allocator<ggml_type>> *local_1e0;
  vector<int,std::allocator<int>> *local_1d8;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_1d0;
  vector<int,std::allocator<int>> *local_1c8;
  vector<int,std::allocator<int>> *local_1c0;
  vector<int,std::allocator<int>> *local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  llama_split_mode *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  llama_split_mode *local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  llama_split_mode *local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  llama_split_mode *local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  llama_split_mode *local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_148;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_b8;
  
  (__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  memset(__return_storage_ptr__,0,0xfc);
  memset(&(__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage,0,0x8c);
  (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->tensor_split).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tensor_split).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tensor_split).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->tensor_split).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_2d8 = &local_2c8;
  local_2d0 = (char *)0x0;
  local_2c8 = 0;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"--","");
  __return_storage_ptr__->verbose = cmd_params_defaults.verbose;
  oVar15 = cmd_params_defaults.output_format_stderr;
  __return_storage_ptr__->output_format = cmd_params_defaults.output_format;
  uVar14 = cmd_params_defaults._592_8_;
  __return_storage_ptr__->output_format_stderr = oVar15;
  iVar31 = cmd_params_defaults.reps;
  __return_storage_ptr__->numa = cmd_params_defaults.numa;
  uVar19 = cmd_params_defaults._592_8_;
  __return_storage_ptr__->reps = iVar31;
  cmd_params_defaults.prio = (ggml_sched_priority)uVar14;
  cmd_params_defaults.delay = SUB84(uVar14,4);
  iVar31 = cmd_params_defaults.delay;
  __return_storage_ptr__->prio = cmd_params_defaults.prio;
  cmd_params_defaults._592_8_ = uVar19;
  __return_storage_ptr__->delay = iVar31;
  __return_storage_ptr__->progress = cmd_params_defaults.progress;
  local_3c8 = (char **)0x0;
  if (argc < 2) {
LAB_0011b003:
    while (((ulong)local_3c8 & 1) != 0) {
      pcVar30 = "error: invalid parameter for argument: %s\n";
      fprintf(_stderr,"error: invalid parameter for argument: %s\n",local_2d8);
      print_usage((int)argv,(char **)pcVar30);
      parse_cmd_params();
      ppcVar29 = argv;
LAB_0011b371:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        local_388._M_allocated_capacity - local_398._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b8);
      local_3c8 = (char **)((ulong)ppcVar29 & 0xffffffff);
    }
    if ((__return_storage_ptr__->model).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->model).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&__return_storage_ptr__->model,&cmd_params_defaults.model);
    }
    if ((__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->n_prompt,&cmd_params_defaults.n_prompt);
    }
    if ((__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->n_gen,&cmd_params_defaults.n_gen);
    }
    if ((__return_storage_ptr__->n_pg).
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->n_pg).
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                (&__return_storage_ptr__->n_pg,&cmd_params_defaults.n_pg);
    }
    if ((__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->n_batch,&cmd_params_defaults.n_batch);
    }
    if ((__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->n_ubatch,&cmd_params_defaults.n_ubatch);
    }
    if ((__return_storage_ptr__->type_k).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->type_k).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<ggml_type,_std::allocator<ggml_type>_>::operator=
                (&__return_storage_ptr__->type_k,&cmd_params_defaults.type_k);
    }
    if ((__return_storage_ptr__->type_v).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->type_v).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<ggml_type,_std::allocator<ggml_type>_>::operator=
                (&__return_storage_ptr__->type_v,&cmd_params_defaults.type_v);
    }
    if ((__return_storage_ptr__->n_gpu_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->n_gpu_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->n_gpu_layers,&cmd_params_defaults.n_gpu_layers);
    }
    if ((__return_storage_ptr__->rpc_servers).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->rpc_servers).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&__return_storage_ptr__->rpc_servers,&cmd_params_defaults.rpc_servers);
    }
    if ((__return_storage_ptr__->split_mode).
        super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->split_mode).
        super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::operator=
                (&__return_storage_ptr__->split_mode,&cmd_params_defaults.split_mode);
    }
    if ((__return_storage_ptr__->main_gpu).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->main_gpu).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->main_gpu,&cmd_params_defaults.main_gpu);
    }
    if (((__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
         (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
       ((__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
      std::vector<bool,_std::allocator<bool>_>::operator=
                (&__return_storage_ptr__->no_kv_offload,&cmd_params_defaults.no_kv_offload);
    }
    if (((__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
         (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
       ((__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
      std::vector<bool,_std::allocator<bool>_>::operator=
                (&__return_storage_ptr__->flash_attn,&cmd_params_defaults.flash_attn);
    }
    if ((__return_storage_ptr__->tensor_split).
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->tensor_split).
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator=(&__return_storage_ptr__->tensor_split,&cmd_params_defaults.tensor_split);
    }
    if (((__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
         (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
       ((__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
      std::vector<bool,_std::allocator<bool>_>::operator=
                (&__return_storage_ptr__->use_mmap,&cmd_params_defaults.use_mmap);
    }
    if (((__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
         (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
       ((__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
      std::vector<bool,_std::allocator<bool>_>::operator=
                (&__return_storage_ptr__->embeddings,&cmd_params_defaults.embeddings);
    }
    if ((__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->n_threads,&cmd_params_defaults.n_threads);
    }
    if ((__return_storage_ptr__->cpu_mask).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->cpu_mask).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&__return_storage_ptr__->cpu_mask,&cmd_params_defaults.cpu_mask);
    }
    if (((__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
         (__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
       ((__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
      std::vector<bool,_std::allocator<bool>_>::operator=
                (&__return_storage_ptr__->cpu_strict,&cmd_params_defaults.cpu_strict);
    }
    if ((__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->poll,&cmd_params_defaults.poll);
    }
    if (local_298 != local_288) {
      operator_delete(local_298,local_288[0] + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
    }
    return __return_storage_ptr__;
  }
  local_258 = &__return_storage_ptr__->output_format;
  local_260 = &__return_storage_ptr__->output_format_stderr;
  local_238 = &__return_storage_ptr__->tensor_split;
  local_250 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->embeddings;
  local_248 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->use_mmap;
  local_240 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->flash_attn;
  local_230 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->no_kv_offload;
  local_228 = &__return_storage_ptr__->main_gpu;
  local_218 = (vector<llama_split_mode,std::allocator<llama_split_mode>> *)
              &__return_storage_ptr__->split_mode;
  local_220 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &__return_storage_ptr__->rpc_servers;
  local_208 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_gpu_layers;
  local_210 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->poll;
  local_200 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->cpu_strict;
  local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &__return_storage_ptr__->cpu_mask;
  local_1f0 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_threads;
  local_1e8 = (vector<ggml_type,std::allocator<ggml_type>> *)&__return_storage_ptr__->type_v;
  local_1e0 = (vector<ggml_type,std::allocator<ggml_type>> *)&__return_storage_ptr__->type_k;
  local_1d8 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_ubatch;
  local_1c8 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_batch;
  local_1d0 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
              &__return_storage_ptr__->n_pg;
  local_1c0 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_gen;
  local_1b8 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_prompt;
  iVar31 = 1;
  local_3c8 = (char **)0x0;
LAB_0011972d:
  pcVar16 = local_2d0;
  pcVar30 = argv[iVar31];
  strlen(pcVar30);
  std::__cxx11::string::_M_replace((ulong)&local_2d8,0,pcVar16,(ulong)pcVar30);
  iVar22 = std::__cxx11::string::compare((ulong)&local_2d8,0,local_290);
  if ((iVar22 == 0) && (local_2d0 != (char *)0x0)) {
    pcVar30 = (char *)0x0;
    do {
      if (local_2d8[(long)pcVar30] == '_') {
        local_2d8[(long)pcVar30] = 0x2d;
      }
      pcVar30 = pcVar30 + 1;
    } while (local_2d0 != pcVar30);
  }
  pcVar30 = "-h";
  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
  if (iVar22 == 0) {
LAB_0011b3a4:
    print_usage((int)argv,(char **)pcVar30);
    exit(0);
  }
  pcVar30 = "--help";
  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
  if (iVar22 == 0) goto LAB_0011b3a4;
  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
  if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
    if (iVar31 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b8,(string *)&local_398,separator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != &local_388) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        (ulong)(local_388._M_allocated_capacity + 1));
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->model).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
LAB_00119d62:
      iVar31 = iVar31 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b8);
      goto LAB_00119e5b;
    }
    goto LAB_0011affc;
  }
  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
  if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
    if (iVar31 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b8,(string *)&local_398,delim);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != &local_388) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        (ulong)(local_388._M_allocated_capacity + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_1b8,
                 (__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
      goto LAB_00119e44;
    }
    goto LAB_0011affc;
  }
  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
  if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
    if (iVar31 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b8,(string *)&local_398,delim_00
                       );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != &local_388) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        (ulong)(local_388._M_allocated_capacity + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_1c0,
                 (__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
      goto LAB_00119e44;
    }
    goto LAB_0011affc;
  }
  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
  if (iVar22 == 0) {
    iVar31 = iVar31 + 1;
    if (argc <= iVar31) goto LAB_0011affc;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_398._M_local_buf,argv[iVar31],(allocator<char> *)&local_2f8);
    string_split<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3b8,(string *)&local_398,separator_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_allocated_capacity != &local_388) {
      operator_delete((void *)local_398._M_allocated_capacity,
                      (ulong)(local_388._M_allocated_capacity + 1));
    }
    lVar32 = local_3b8._8_8_ - local_3b8._0_8_;
    ppcVar29 = (char **)0x1;
    if (lVar32 == 0x40) {
      paVar1 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_3b8._0_8_;
      local_308 = (string *)__errno_location();
      local_2fc = *(int *)&(local_308->_M_dataplus)._M_p;
      *(int *)&(local_308->_M_dataplus)._M_p = 0;
      lVar25 = strtol(paVar1->_M_local_buf,(char **)&local_398._M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity == paVar1) goto LAB_0011b401;
      if (((int)(flag_type)lVar25 == lVar25) &&
         (iVar22 = *(int *)&(local_308->_M_dataplus)._M_p, iVar22 != 0x22)) {
        if (iVar22 == 0) {
          *(int *)&(local_308->_M_dataplus)._M_p = local_2fc;
        }
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(((string *)(local_3b8._0_8_ + 0x20))->_M_dataplus)._M_p;
        local_2fc = *(int *)&(local_308->_M_dataplus)._M_p;
        *(int *)&(local_308->_M_dataplus)._M_p = 0;
        lVar26 = strtol(paVar1->_M_local_buf,(char **)&local_398._M_allocated_capacity,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != paVar1) {
          if ((0xfffffffeffffffff < lVar26 - 0x80000000U) &&
             (iVar22 = *(int *)&(local_308->_M_dataplus)._M_p, iVar22 != 0x22)) {
            if (iVar22 == 0) {
              *(int *)&(local_308->_M_dataplus)._M_p = local_2fc;
            }
            local_2f8._4_4_ = SUB84(lVar26,0);
            local_2f8._M_flags = (flag_type)lVar25;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<std::pair<int,int>>(local_1d0,(pair<int,_int> *)&local_2f8);
            ppcVar29 = local_3c8;
            goto LAB_0011a066;
          }
          std::__throw_out_of_range("stoi");
        }
        std::__throw_invalid_argument("stoi");
      }
      std::__throw_out_of_range("stoi");
LAB_0011b401:
      std::__throw_invalid_argument("stoi");
LAB_0011b40d:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llama-bench/llama-bench.cpp"
                 ,0x224,"GGML_ASSERT(%s) failed","split_arg.size() <= llama_max_devices()");
    }
LAB_0011a066:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3b8);
    local_3c8 = ppcVar29;
    if (lVar32 == 0x40) goto LAB_00119e5b;
    goto LAB_0011b003;
  }
  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
  if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
    if (argc <= iVar31 + 1) goto LAB_0011affc;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
    string_split<int>((vector<int,_std::allocator<int>_> *)local_3b8,(string *)&local_398,delim_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_allocated_capacity != &local_388) {
      operator_delete((void *)local_398._M_allocated_capacity,
                      (ulong)(local_388._M_allocated_capacity + 1));
    }
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_1c8,
               (__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
  }
  else {
    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
    if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0))
    {
      if (argc <= iVar31 + 1) goto LAB_0011affc;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b8,(string *)&local_398,delim_02
                       );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != &local_388) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        (ulong)(local_388._M_allocated_capacity + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_1d8,
                 (__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
      goto LAB_00119e44;
    }
    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
    ppcVar29 = local_3c8;
    if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0))
    {
      if (argc <= iVar31 + 1) goto LAB_0011affc;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b8,(string *)&local_398,separator_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != &local_388) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        (ulong)(local_388._M_allocated_capacity + 1));
      }
      local_398._M_allocated_capacity = 0;
      local_398._8_8_ = (llama_split_mode *)0x0;
      local_388._M_allocated_capacity = 0;
      local_308 = (string *)local_3b8._8_8_;
      psVar35 = (string *)local_3b8._0_8_;
      if (local_3b8._0_8_ != local_3b8._8_8_) {
        do {
          fVar23 = ggml_type_from_name(psVar35);
          ppcVar29 = (char **)0x1;
          local_2f8._M_flags = fVar23;
          if (fVar23 != 0x27) {
            ppcVar29 = local_3c8;
            if (local_398._8_8_ == local_388._M_allocated_capacity) {
              std::vector<ggml_type,std::allocator<ggml_type>>::_M_realloc_insert<ggml_type_const&>
                        ((vector<ggml_type,std::allocator<ggml_type>> *)local_398._M_local_buf,
                         (iterator)local_398._8_8_,&local_2f8._M_flags);
            }
            else {
              *(flag_type *)local_398._8_8_ = fVar23;
              local_398._8_8_ = local_398._8_8_ + 4;
            }
          }
        } while ((fVar23 != 0x27) &&
                (psVar35 = psVar35 + 1, local_3c8 = ppcVar29, psVar35 != local_308));
      }
      if (ppcVar29 != (char **)0x0) goto LAB_0011b371;
      std::vector<ggml_type,std::allocator<ggml_type>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<ggml_type*,std::vector<ggml_type,std::allocator<ggml_type>>>>
                (local_1e0,
                 (__return_storage_ptr__->type_k).
                 super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_398._M_allocated_capacity,local_398._8_8_);
LAB_0011a338:
      iVar31 = iVar31 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        local_388._M_allocated_capacity - local_398._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b8);
      local_3c8 = ppcVar29;
      goto LAB_00119e5b;
    }
    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
    if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0))
    {
      if (iVar31 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
        string_split<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3b8,(string *)&local_398,separator_02);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          (ulong)(local_388._M_allocated_capacity + 1));
        }
        local_398._M_allocated_capacity = 0;
        local_398._8_8_ = (llama_split_mode *)0x0;
        local_388._M_allocated_capacity = 0;
        local_308 = (string *)local_3b8._8_8_;
        psVar35 = (string *)local_3b8._0_8_;
        if (local_3b8._0_8_ != local_3b8._8_8_) {
          do {
            fVar23 = ggml_type_from_name(psVar35);
            ppcVar29 = (char **)0x1;
            local_2f8._M_flags = fVar23;
            if (fVar23 != 0x27) {
              ppcVar29 = local_3c8;
              if (local_398._8_8_ == local_388._M_allocated_capacity) {
                std::vector<ggml_type,std::allocator<ggml_type>>::
                _M_realloc_insert<ggml_type_const&>
                          ((vector<ggml_type,std::allocator<ggml_type>> *)local_398._M_local_buf,
                           (iterator)local_398._8_8_,&local_2f8._M_flags);
              }
              else {
                *(flag_type *)local_398._8_8_ = fVar23;
                local_398._8_8_ = local_398._8_8_ + 4;
              }
            }
          } while ((fVar23 != 0x27) &&
                  (psVar35 = psVar35 + 1, local_3c8 = ppcVar29, psVar35 != local_308));
        }
        if (ppcVar29 != (char **)0x0) goto LAB_0011b371;
        std::vector<ggml_type,std::allocator<ggml_type>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<ggml_type*,std::vector<ggml_type,std::allocator<ggml_type>>>>
                  (local_1e8,
                   (__return_storage_ptr__->type_v).
                   super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_398._M_allocated_capacity,local_398._8_8_
                  );
        goto LAB_0011a338;
      }
LAB_0011affc:
      local_3c8 = (char **)0x1;
      goto LAB_0011b003;
    }
    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
    if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0))
    {
      if (iVar31 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
        string_split<int>((vector<int,_std::allocator<int>_> *)local_3b8,(string *)&local_398,
                          delim_03);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          (ulong)(local_388._M_allocated_capacity + 1));
        }
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (local_1f0,
                   (__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
        goto LAB_00119e44;
      }
      goto LAB_0011affc;
    }
    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
    if ((iVar22 == 0) || (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0))
    {
      if (iVar31 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
        string_split<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3b8,(string *)&local_398,separator_03);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          (ulong)(local_388._M_allocated_capacity + 1));
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_1f8,
                   (__return_storage_ptr__->cpu_mask).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
        goto LAB_00119d62;
      }
      goto LAB_0011affc;
    }
    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
    if (iVar22 == 0) {
      iVar31 = iVar31 + 1;
      if (iVar31 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3b8,argv[iVar31],(allocator<char> *)&local_2f8);
        string_split<bool>((vector<bool,_std::allocator<bool>_> *)&local_398,(string *)local_3b8,
                           delim_04);
        if ((string *)local_3b8._0_8_ != (string *)(local_3b8 + 0x10)) {
          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
        }
        p_Var13 = &(__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl;
        uVar3 = (p_Var13->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
        uVar4 = (p_Var13->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
        __position.super__Bit_iterator_base._M_offset = uVar4;
        __position.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
        local_158 = (llama_split_mode *)local_388._M_allocated_capacity;
        uStack_150 = local_388._8_4_;
        __last.super__Bit_iterator_base._12_4_ = uStack_14c;
        __last.super__Bit_iterator_base._M_offset = local_388._8_4_;
        __last.super__Bit_iterator_base._M_p = (_Bit_type *)local_388._M_allocated_capacity;
        __position.super__Bit_iterator_base._12_4_ = 0;
        __first.super__Bit_iterator_base._8_8_ = 0;
        __first.super__Bit_iterator_base._M_p = (_Bit_type *)local_398._M_allocated_capacity;
        std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                  (local_200,__position,__first,__last);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_398._M_allocated_capacity,local_378 - local_398._0_8_);
          local_398._M_allocated_capacity = 0;
          local_398._8_8_ = local_398._8_8_ & 0xffffffff00000000;
          local_388._M_allocated_capacity = 0;
          local_388._8_4_ = 0;
          local_378 = 0;
        }
        goto LAB_00119e5b;
      }
      goto LAB_0011affc;
    }
    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
    if (iVar22 == 0) {
      if (argc <= iVar31 + 1) goto LAB_0011affc;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b8,(string *)&local_398,delim_06
                       );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != &local_388) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        (ulong)(local_388._M_allocated_capacity + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_210,
                 (__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
      goto LAB_00119e44;
    }
    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
    if ((iVar22 != 0) && (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 != 0))
    {
      cVar20 = llama_supports_rpc();
      if ((cVar20 == '\0') ||
         ((iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 != 0 &&
          (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 != 0)))) {
        iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
        if ((iVar22 == 0) ||
           (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
          if (iVar31 + 1 < argc) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_398._M_local_buf,argv[iVar31 + 1],
                       (allocator<char> *)&local_2f8);
            string_split<std::__cxx11::string>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3b8,(string *)&local_398,separator_04);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            uVar14 = local_3b8._8_8_;
            local_398._M_allocated_capacity = 0;
            local_398._8_8_ = (llama_split_mode *)0x0;
            local_388._M_allocated_capacity = 0;
            for (psVar35 = (string *)local_3b8._0_8_; ppcVar29 = local_3c8,
                psVar35 != (string *)uVar14; psVar35 = psVar35 + 1) {
              iVar22 = std::__cxx11::string::compare((char *)psVar35);
              if (iVar22 == 0) {
                local_2f8._M_flags = 0;
LAB_0011a6f5:
                if (local_398._8_8_ == local_388._M_allocated_capacity) {
                  std::vector<llama_split_mode,std::allocator<llama_split_mode>>::
                  _M_realloc_insert<llama_split_mode_const&>
                            ((vector<llama_split_mode,std::allocator<llama_split_mode>> *)
                             local_398._M_local_buf,(iterator)local_398._8_8_,&local_2f8._M_flags);
                }
                else {
                  *(flag_type *)local_398._8_8_ = local_2f8._M_flags;
                  local_398._8_8_ = local_398._8_8_ + 4;
                }
                bVar21 = false;
                ppcVar29 = local_3c8;
              }
              else {
                iVar22 = std::__cxx11::string::compare((char *)psVar35);
                if (iVar22 == 0) {
                  local_2f8._M_flags = 1;
                  goto LAB_0011a6f5;
                }
                iVar22 = std::__cxx11::string::compare((char *)psVar35);
                bVar21 = true;
                ppcVar29 = (char **)0x1;
                if (iVar22 == 0) {
                  local_2f8._M_flags = 2;
                  goto LAB_0011a6f5;
                }
              }
              if (bVar21) break;
              local_3c8 = ppcVar29;
            }
            if (ppcVar29 == (char **)0x0) {
              std::vector<llama_split_mode,std::allocator<llama_split_mode>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<llama_split_mode*,std::vector<llama_split_mode,std::allocator<llama_split_mode>>>>
                        (local_218,
                         (__return_storage_ptr__->split_mode).
                         super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>.
                         _M_impl.super__Vector_impl_data._M_finish,local_398._M_allocated_capacity,
                         local_398._8_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_allocated_capacity !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete((void *)local_398._M_allocated_capacity,
                                local_388._M_allocated_capacity - local_398._0_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3b8);
LAB_0011a792:
              iVar31 = iVar31 + 1;
              local_3c8 = ppcVar29;
              goto LAB_00119e5b;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              local_388._M_allocated_capacity - local_398._0_8_);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3b8);
            local_3c8 = ppcVar29;
            goto LAB_0011b003;
          }
        }
        else {
          iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
          if ((iVar22 == 0) ||
             (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
            if (iVar31 + 1 < argc) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_398._M_local_buf,argv[iVar31 + 1],
                         (allocator<char> *)&local_2f8);
              string_split<int>((vector<int,_std::allocator<int>_> *)local_3b8,(string *)&local_398,
                                delim_07);
              std::vector<int,_std::allocator<int>_>::_M_move_assign(local_228);
              if ((string *)local_3b8._0_8_ != (string *)0x0) {
                operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ - local_3b8._0_8_);
              }
              goto LAB_0011a837;
            }
          }
          else {
            iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
            if ((iVar22 == 0) ||
               (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
              if (iVar31 + 1 < argc) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_3b8,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
                string_split<bool>((vector<bool,_std::allocator<bool>_> *)&local_398,
                                   (string *)local_3b8,delim_08);
                if ((string *)local_3b8._0_8_ != (string *)(local_3b8 + 0x10)) {
                  operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
                }
                p_Var13 = &(__return_storage_ptr__->no_kv_offload).
                           super__Bvector_base<std::allocator<bool>_>._M_impl;
                uVar5 = (p_Var13->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
                uVar6 = (p_Var13->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.
                        _M_offset;
                __position_00.super__Bit_iterator_base._M_offset = uVar6;
                __position_00.super__Bit_iterator_base._M_p = (_Bit_type *)uVar5;
                local_168 = (llama_split_mode *)local_388._M_allocated_capacity;
                uStack_160 = local_388._8_4_;
                __last_00.super__Bit_iterator_base._12_4_ = uStack_15c;
                __last_00.super__Bit_iterator_base._M_offset = local_388._8_4_;
                __last_00.super__Bit_iterator_base._M_p =
                     (_Bit_type *)local_388._M_allocated_capacity;
                __position_00.super__Bit_iterator_base._12_4_ = 0;
                __first_00.super__Bit_iterator_base._8_8_ = 0;
                __first_00.super__Bit_iterator_base._M_p =
                     (_Bit_type *)local_398._M_allocated_capacity;
                std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                          (local_230,__position_00,__first_00,__last_00);
                goto LAB_0011a8fa;
              }
            }
            else {
              iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
              if (iVar22 == 0) {
                iVar31 = iVar31 + 1;
                if (iVar31 < argc) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_398._M_local_buf,argv[iVar31],
                             (allocator<char> *)local_3b8);
                  iVar22 = std::__cxx11::string::compare(local_398._M_local_buf);
                  gVar33 = GGML_NUMA_STRATEGY_DISTRIBUTE;
                  if ((iVar22 == 0) ||
                     (iVar22 = std::__cxx11::string::compare(local_398._M_local_buf), iVar22 == 0))
                  {
LAB_0011abbd:
                    __return_storage_ptr__->numa = gVar33;
                    bVar21 = true;
                  }
                  else {
                    iVar22 = std::__cxx11::string::compare(local_398._M_local_buf);
                    if (iVar22 == 0) {
                      gVar33 = GGML_NUMA_STRATEGY_ISOLATE;
                      goto LAB_0011abbd;
                    }
                    iVar22 = std::__cxx11::string::compare(local_398._M_local_buf);
                    if (iVar22 == 0) {
                      gVar33 = GGML_NUMA_STRATEGY_NUMACTL;
                      goto LAB_0011abbd;
                    }
                    local_3c8 = (char **)0x1;
                    bVar21 = false;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_allocated_capacity != &local_388) {
                    operator_delete((void *)local_398._M_allocated_capacity,
                                    (ulong)(local_388._M_allocated_capacity + 1));
                  }
                  if (bVar21) goto LAB_00119e5b;
                  goto LAB_0011b003;
                }
              }
              else {
                iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                if ((iVar22 == 0) ||
                   (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
                  if (iVar31 + 1 < argc) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_3b8,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
                    string_split<bool>((vector<bool,_std::allocator<bool>_> *)&local_398,
                                       (string *)local_3b8,delim_09);
                    if ((string *)local_3b8._0_8_ != (string *)(local_3b8 + 0x10)) {
                      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
                    }
                    p_Var13 = &(__return_storage_ptr__->flash_attn).
                               super__Bvector_base<std::allocator<bool>_>._M_impl;
                    uVar7 = (p_Var13->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.
                            _M_p;
                    uVar8 = (p_Var13->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.
                            _M_offset;
                    __position_01.super__Bit_iterator_base._M_offset = uVar8;
                    __position_01.super__Bit_iterator_base._M_p = (_Bit_type *)uVar7;
                    local_178 = (llama_split_mode *)local_388._M_allocated_capacity;
                    uStack_170 = local_388._8_4_;
                    __last_01.super__Bit_iterator_base._12_4_ = uStack_16c;
                    __last_01.super__Bit_iterator_base._M_offset = local_388._8_4_;
                    __last_01.super__Bit_iterator_base._M_p =
                         (_Bit_type *)local_388._M_allocated_capacity;
                    __position_01.super__Bit_iterator_base._12_4_ = 0;
                    __first_01.super__Bit_iterator_base._8_8_ = 0;
                    __first_01.super__Bit_iterator_base._M_p =
                         (_Bit_type *)local_398._M_allocated_capacity;
                    std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                              (local_240,__position_01,__first_01,__last_01);
LAB_0011a8fa:
                    iVar31 = iVar31 + 1;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_398._M_allocated_capacity !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      operator_delete((void *)local_398._M_allocated_capacity,
                                      local_378 - local_398._0_8_);
                      local_398._M_allocated_capacity = 0;
                      local_398._8_8_ = local_398._8_8_ & 0xffffffff00000000;
                      local_388._M_allocated_capacity = 0;
                      local_388._8_4_ = 0;
                      local_378 = 0;
                    }
                    goto LAB_00119e5b;
                  }
                }
                else {
                  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                  if ((iVar22 == 0) ||
                     (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
                    if (iVar31 + 1 < argc) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_3b8,argv[iVar31 + 1],(allocator<char> *)&local_2f8)
                      ;
                      string_split<bool>((vector<bool,_std::allocator<bool>_> *)&local_398,
                                         (string *)local_3b8,delim_10);
                      if ((string *)local_3b8._0_8_ != (string *)(local_3b8 + 0x10)) {
                        operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
                      }
                      p_Var13 = &(__return_storage_ptr__->use_mmap).
                                 super__Bvector_base<std::allocator<bool>_>._M_impl;
                      uVar9 = (p_Var13->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base
                              ._M_p;
                      uVar10 = (p_Var13->super__Bvector_impl_data)._M_finish.
                               super__Bit_iterator_base._M_offset;
                      __position_02.super__Bit_iterator_base._M_offset = uVar10;
                      __position_02.super__Bit_iterator_base._M_p = (_Bit_type *)uVar9;
                      local_188 = (llama_split_mode *)local_388._M_allocated_capacity;
                      uStack_180 = local_388._8_4_;
                      __last_02.super__Bit_iterator_base._12_4_ = uStack_17c;
                      __last_02.super__Bit_iterator_base._M_offset = local_388._8_4_;
                      __last_02.super__Bit_iterator_base._M_p =
                           (_Bit_type *)local_388._M_allocated_capacity;
                      __position_02.super__Bit_iterator_base._12_4_ = 0;
                      __first_02.super__Bit_iterator_base._8_8_ = 0;
                      __first_02.super__Bit_iterator_base._M_p =
                           (_Bit_type *)local_398._M_allocated_capacity;
                      std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                                (local_248,__position_02,__first_02,__last_02);
                      goto LAB_0011a8fa;
                    }
                  }
                  else {
                    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                    if ((iVar22 == 0) ||
                       (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)) {
                      if (iVar31 + 1 < argc) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_3b8,argv[iVar31 + 1],
                                   (allocator<char> *)&local_2f8);
                        string_split<bool>((vector<bool,_std::allocator<bool>_> *)&local_398,
                                           (string *)local_3b8,delim_11);
                        if ((string *)local_3b8._0_8_ != (string *)(local_3b8 + 0x10)) {
                          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
                        }
                        p_Var13 = &(__return_storage_ptr__->embeddings).
                                   super__Bvector_base<std::allocator<bool>_>._M_impl;
                        uVar11 = (p_Var13->super__Bvector_impl_data)._M_finish.
                                 super__Bit_iterator_base._M_p;
                        uVar12 = (p_Var13->super__Bvector_impl_data)._M_finish.
                                 super__Bit_iterator_base._M_offset;
                        __position_03.super__Bit_iterator_base._M_offset = uVar12;
                        __position_03.super__Bit_iterator_base._M_p = (_Bit_type *)uVar11;
                        local_198 = (llama_split_mode *)local_388._M_allocated_capacity;
                        uStack_190 = local_388._8_4_;
                        __last_03.super__Bit_iterator_base._12_4_ = uStack_18c;
                        __last_03.super__Bit_iterator_base._M_offset = local_388._8_4_;
                        __last_03.super__Bit_iterator_base._M_p =
                             (_Bit_type *)local_388._M_allocated_capacity;
                        __position_03.super__Bit_iterator_base._12_4_ = 0;
                        __first_03.super__Bit_iterator_base._8_8_ = 0;
                        __first_03.super__Bit_iterator_base._M_p =
                             (_Bit_type *)local_398._M_allocated_capacity;
                        std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                                  (local_250,__position_03,__first_03,__last_03);
                        goto LAB_0011a8fa;
                      }
                    }
                    else {
                      iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                      if ((iVar22 == 0) ||
                         (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0))
                      {
                        iVar31 = iVar31 + 1;
                        if (iVar31 < argc) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_398._M_local_buf,argv[iVar31],
                                     (allocator<char> *)local_3b8);
                          string_split<std::__cxx11::string>
                                    (&local_1b0,(string *)&local_398,separator_05);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._M_allocated_capacity != &local_388) {
                            operator_delete((void *)local_398._M_allocated_capacity,
                                            (ulong)(local_388._M_allocated_capacity + 1));
                          }
                          local_308 = local_1b0.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish;
                          pbVar34 = local_1b0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          if (local_1b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start !=
                              local_1b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                            do {
                              local_3b8._0_8_ = local_3b8 + 0x10;
                              pcVar2 = (pbVar34->_M_dataplus)._M_p;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)local_3b8,pcVar2,
                                         pcVar2 + pbVar34->_M_string_length);
                              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                              basic_regex(&local_2f8,"[;/]+",0x10);
                              std::__cxx11::
                              regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                              ::regex_token_iterator
                                        ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                          *)&local_398,
                                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          )local_3b8._0_8_,
                                         (char *)(local_3b8._0_8_ +
                                                 (long)(_Alloc_hider *)local_3b8._8_8_),&local_2f8,
                                         -1,0);
                              std::__cxx11::
                              regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                              ::regex_token_iterator
                                        (&local_b8,
                                         (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                          *)&local_398);
                              local_148._M_suffix.
                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .second._M_current._0_1_ = 0;
                              local_148._M_suffix._9_8_ = 0;
                              local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              local_148._M_suffix.
                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .first._M_current._0_1_ = 0;
                              local_148._M_suffix.
                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .first._M_current._1_7_ = 0;
                              local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                              local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              local_148._M_position._M_match.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              local_148._M_position._M_match._M_begin._M_current = (char *)0x0;
                              local_148._M_position._M_match.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                              local_148._M_position._M_match.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              local_148._M_position._M_pregex = (regex_type *)0x0;
                              local_148._M_position._M_flags = 0;
                              local_148._M_position._28_4_ = 0;
                              local_148._M_position._M_begin._M_current = (char *)0x0;
                              local_148._M_position._M_end._M_current = (char *)0x0;
                              local_148._M_n = 0;
                              local_148._M_result = (value_type *)0x0;
                              local_148._M_has_m1 = false;
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::
                              vector<std::__cxx11::regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>,void>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)&local_278,&local_b8,&local_148,
                                         (allocator_type *)&local_2b0);
                              std::__cxx11::
                              regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                              ::~regex_token_iterator(&local_148);
                              std::__cxx11::
                              regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                              ::~regex_token_iterator(&local_b8);
                              pbVar18 = local_278.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish;
                              pbVar17 = local_278.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              uVar27 = llama_max_devices();
                              if (uVar27 < (ulong)((long)pbVar18 - (long)pbVar17 >> 5))
                              goto LAB_0011b40d;
                              __n = llama_max_devices();
                              std::vector<float,_std::allocator<float>_>::vector
                                        (&local_2b0,__n,&local_2b1);
                              lVar32 = 0;
                              for (uVar27 = 0; uVar28 = llama_max_devices(), uVar27 < uVar28;
                                  uVar27 = uVar27 + 1) {
                                fVar36 = 0.0;
                                if (uVar27 < (ulong)((long)local_278.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_278.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                                  fVar36 = std::__cxx11::stof((string *)
                                                              ((long)&((local_278.
                                                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar32),(size_t *)0x0);
                                }
                                local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar27] = fVar36;
                                lVar32 = lVar32 + 0x20;
                              }
                              std::
                              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ::push_back(local_238,&local_2b0);
                              if (local_2b0.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                operator_delete(local_2b0.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start,
                                                (long)local_2b0.
                                                                                                            
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)local_2b0.
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                              }
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~vector(&local_278);
                              std::__cxx11::
                              regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                              ::~regex_token_iterator
                                        ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                          *)&local_398);
                              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                              ~basic_regex(&local_2f8);
                              if ((string *)local_3b8._0_8_ != (string *)(local_3b8 + 0x10)) {
                                operator_delete((void *)local_3b8._0_8_,
                                                (ulong)(local_3b8._16_8_ + 1));
                              }
                              pbVar34 = pbVar34 + 1;
                            } while (pbVar34 != local_308);
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector(&local_1b0);
                          goto LAB_00119e5b;
                        }
                      }
                      else {
                        iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                        if ((iVar22 == 0) ||
                           (iVar22 = std::__cxx11::string::compare((char *)&local_2d8), iVar22 == 0)
                           ) {
                          if (iVar31 + 1 < argc) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_398._M_local_buf,argv[iVar31 + 1],
                                       (allocator<char> *)local_3b8);
                            iVar22 = std::__cxx11::stoi((string *)&local_398,(size_t *)0x0,10);
                            __return_storage_ptr__->reps = iVar22;
LAB_0011a837:
                            iVar31 = iVar31 + 1;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_398._M_allocated_capacity != &local_388) {
                              operator_delete((void *)local_398._M_allocated_capacity,
                                              (ulong)(local_388._M_allocated_capacity + 1));
                            }
                            goto LAB_00119e5b;
                          }
                        }
                        else {
                          iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                          if (iVar22 == 0) {
                            if (iVar31 + 1 < argc) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_398._M_local_buf,argv[iVar31 + 1],
                                         (allocator<char> *)local_3b8);
                              gVar24 = std::__cxx11::stoi((string *)&local_398,(size_t *)0x0,10);
                              __return_storage_ptr__->prio = gVar24;
                              goto LAB_0011a837;
                            }
                          }
                          else {
                            iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                            if (iVar22 == 0) {
                              if (iVar31 + 1 < argc) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_398._M_local_buf,argv[iVar31 + 1],
                                           (allocator<char> *)local_3b8);
                                iVar22 = std::__cxx11::stoi((string *)&local_398,(size_t *)0x0,10);
                                __return_storage_ptr__->delay = iVar22;
                                goto LAB_0011a837;
                              }
                            }
                            else {
                              iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                              if ((iVar22 == 0) ||
                                 (iVar22 = std::__cxx11::string::compare((char *)&local_2d8),
                                 iVar22 == 0)) {
                                if (iVar31 + 1 < argc) {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_398._M_local_buf,argv[iVar31 + 1],
                                             (allocator<char> *)local_3b8);
                                  format = local_258;
LAB_0011afbe:
                                  bVar21 = output_format_from_str((string *)&local_398,format);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_398._M_allocated_capacity != &local_388) {
                                    operator_delete((void *)local_398._M_allocated_capacity,
                                                    (ulong)(local_388._M_allocated_capacity + 1));
                                  }
                                  ppcVar29 = (char **)((ulong)bVar21 ^ 1);
                                  goto LAB_0011a792;
                                }
                              }
                              else {
                                iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                                if ((iVar22 != 0) &&
                                   (iVar22 = std::__cxx11::string::compare((char *)&local_2d8),
                                   iVar22 != 0)) {
                                  iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                                  if ((iVar22 == 0) ||
                                     (iVar22 = std::__cxx11::string::compare((char *)&local_2d8),
                                     iVar22 == 0)) {
                                    __return_storage_ptr__->verbose = true;
                                  }
                                  else {
                                    iVar22 = std::__cxx11::string::compare((char *)&local_2d8);
                                    if (iVar22 != 0) goto LAB_0011b3b3;
                                    __return_storage_ptr__->progress = true;
                                  }
                                  goto LAB_00119e5b;
                                }
                                if (iVar31 + 1 < argc) {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_398._M_local_buf,argv[iVar31 + 1],
                                             (allocator<char> *)local_3b8);
                                  format = local_260;
                                  goto LAB_0011afbe;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if (iVar31 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)local_3b8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398);
        goto LAB_0011a837;
      }
LAB_0011b3b3:
      local_3c8 = (char **)0x1;
      goto LAB_0011b003;
    }
    if (argc <= iVar31 + 1) goto LAB_0011affc;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_398._M_local_buf,argv[iVar31 + 1],(allocator<char> *)&local_2f8);
    string_split<int>((vector<int,_std::allocator<int>_> *)local_3b8,(string *)&local_398,delim_05);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_allocated_capacity != &local_388) {
      operator_delete((void *)local_398._M_allocated_capacity,
                      (ulong)(local_388._M_allocated_capacity + 1));
    }
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_208,
               (__return_storage_ptr__->n_gpu_layers).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish,local_3b8._0_8_,local_3b8._8_8_);
  }
LAB_00119e44:
  iVar31 = iVar31 + 1;
  if ((string *)local_3b8._0_8_ != (string *)0x0) {
    operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ - local_3b8._0_8_);
  }
LAB_00119e5b:
  iVar31 = iVar31 + 1;
  if (argc <= iVar31) goto LAB_0011b003;
  goto LAB_0011972d;
}

Assistant:

static cmd_params parse_cmd_params(int argc, char ** argv) {
    cmd_params        params;
    std::string       arg;
    bool              invalid_param = false;
    const std::string arg_prefix    = "--";
    const char        split_delim   = ',';

    params.verbose              = cmd_params_defaults.verbose;
    params.output_format        = cmd_params_defaults.output_format;
    params.output_format_stderr = cmd_params_defaults.output_format_stderr;
    params.reps                 = cmd_params_defaults.reps;
    params.numa                 = cmd_params_defaults.numa;
    params.prio                 = cmd_params_defaults.prio;
    params.delay                = cmd_params_defaults.delay;
    params.progress             = cmd_params_defaults.progress;

    for (int i = 1; i < argc; i++) {
        arg = argv[i];
        if (arg.compare(0, arg_prefix.size(), arg_prefix) == 0) {
            std::replace(arg.begin(), arg.end(), '_', '-');
        }

        if (arg == "-h" || arg == "--help") {
            print_usage(argc, argv);
            exit(0);
        } else if (arg == "-m" || arg == "--model") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], split_delim);
            params.model.insert(params.model.end(), p.begin(), p.end());
        } else if (arg == "-p" || arg == "--n-prompt") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_prompt.insert(params.n_prompt.end(), p.begin(), p.end());
        } else if (arg == "-n" || arg == "--n-gen") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_gen.insert(params.n_gen.end(), p.begin(), p.end());
        } else if (arg == "-pg") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], ',');
            if (p.size() != 2) {
                invalid_param = true;
                break;
            }
            params.n_pg.push_back({ std::stoi(p[0]), std::stoi(p[1]) });
        } else if (arg == "-b" || arg == "--batch-size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_batch.insert(params.n_batch.end(), p.begin(), p.end());
        } else if (arg == "-ub" || arg == "--ubatch-size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_ubatch.insert(params.n_ubatch.end(), p.begin(), p.end());
        } else if (arg == "-ctk" || arg == "--cache-type-k") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                   p = string_split<std::string>(argv[i], split_delim);
            std::vector<ggml_type> types;
            for (const auto & t : p) {
                ggml_type gt = ggml_type_from_name(t);
                if (gt == GGML_TYPE_COUNT) {
                    invalid_param = true;
                    break;
                }
                types.push_back(gt);
            }
            if (invalid_param) {
                break;
            }
            params.type_k.insert(params.type_k.end(), types.begin(), types.end());
        } else if (arg == "-ctv" || arg == "--cache-type-v") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                   p = string_split<std::string>(argv[i], split_delim);
            std::vector<ggml_type> types;
            for (const auto & t : p) {
                ggml_type gt = ggml_type_from_name(t);
                if (gt == GGML_TYPE_COUNT) {
                    invalid_param = true;
                    break;
                }
                types.push_back(gt);
            }
            if (invalid_param) {
                break;
            }
            params.type_v.insert(params.type_v.end(), types.begin(), types.end());
        } else if (arg == "-t" || arg == "--threads") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_threads.insert(params.n_threads.end(), p.begin(), p.end());
        } else if (arg == "-C" || arg == "--cpu-mask") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], split_delim);
            params.cpu_mask.insert(params.cpu_mask.end(), p.begin(), p.end());
        } else if (arg == "--cpu-strict") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.cpu_strict.insert(params.cpu_strict.end(), p.begin(), p.end());
        } else if (arg == "--poll") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.poll.insert(params.poll.end(), p.begin(), p.end());
        } else if (arg == "-ngl" || arg == "--n-gpu-layers") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_gpu_layers.insert(params.n_gpu_layers.end(), p.begin(), p.end());
        } else if (llama_supports_rpc() && (arg == "-rpc" || arg == "--rpc")) {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.rpc_servers.push_back(argv[i]);
        } else if (arg == "-sm" || arg == "--split-mode") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                          p = string_split<std::string>(argv[i], split_delim);
            std::vector<llama_split_mode> modes;
            for (const auto & m : p) {
                llama_split_mode mode;
                if (m == "none") {
                    mode = LLAMA_SPLIT_MODE_NONE;
                } else if (m == "layer") {
                    mode = LLAMA_SPLIT_MODE_LAYER;
                } else if (m == "row") {
                    mode = LLAMA_SPLIT_MODE_ROW;
                } else {
                    invalid_param = true;
                    break;
                }
                modes.push_back(mode);
            }
            if (invalid_param) {
                break;
            }
            params.split_mode.insert(params.split_mode.end(), modes.begin(), modes.end());
        } else if (arg == "-mg" || arg == "--main-gpu") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.main_gpu = string_split<int>(argv[i], split_delim);
        } else if (arg == "-nkvo" || arg == "--no-kv-offload") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.no_kv_offload.insert(params.no_kv_offload.end(), p.begin(), p.end());
        } else if (arg == "--numa") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            } else {
                std::string value(argv[i]);
                /**/ if (value == "distribute" || value == "") {
                    params.numa = GGML_NUMA_STRATEGY_DISTRIBUTE;
                } else if (value == "isolate") {
                    params.numa = GGML_NUMA_STRATEGY_ISOLATE;
                } else if (value == "numactl") {
                    params.numa = GGML_NUMA_STRATEGY_NUMACTL;
                } else {
                    invalid_param = true;
                    break;
                }
            }
        } else if (arg == "-fa" || arg == "--flash-attn") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.flash_attn.insert(params.flash_attn.end(), p.begin(), p.end());
        } else if (arg == "-mmp" || arg == "--mmap") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.use_mmap.insert(params.use_mmap.end(), p.begin(), p.end());
        } else if (arg == "-embd" || arg == "--embeddings") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.embeddings.insert(params.embeddings.end(), p.begin(), p.end());
        } else if (arg == "-ts" || arg == "--tensor-split") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            for (auto ts : string_split<std::string>(argv[i], split_delim)) {
                // split string by ; and /
                const std::regex           regex{ R"([;/]+)" };
                std::sregex_token_iterator it{ ts.begin(), ts.end(), regex, -1 };
                std::vector<std::string>   split_arg{ it, {} };
                GGML_ASSERT(split_arg.size() <= llama_max_devices());

                std::vector<float> tensor_split(llama_max_devices());
                for (size_t i = 0; i < llama_max_devices(); ++i) {
                    if (i < split_arg.size()) {
                        tensor_split[i] = std::stof(split_arg[i]);
                    } else {
                        tensor_split[i] = 0.0f;
                    }
                }
                params.tensor_split.push_back(tensor_split);
            }
        } else if (arg == "-r" || arg == "--repetitions") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.reps = std::stoi(argv[i]);
        } else if (arg == "--prio") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.prio = (enum ggml_sched_priority) std::stoi(argv[i]);
        } else if (arg == "--delay") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.delay = std::stoi(argv[i]);
        } else if (arg == "-o" || arg == "--output") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            invalid_param = !output_format_from_str(argv[i], params.output_format);
        } else if (arg == "-oe" || arg == "--output-err") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            invalid_param = !output_format_from_str(argv[i], params.output_format_stderr);
        } else if (arg == "-v" || arg == "--verbose") {
            params.verbose = true;
        } else if (arg == "--progress") {
            params.progress = true;
        } else {
            invalid_param = true;
            break;
        }
    }
    if (invalid_param) {
        fprintf(stderr, "error: invalid parameter for argument: %s\n", arg.c_str());
        print_usage(argc, argv);
        exit(1);
    }

    // set defaults
    if (params.model.empty()) {
        params.model = cmd_params_defaults.model;
    }
    if (params.n_prompt.empty()) {
        params.n_prompt = cmd_params_defaults.n_prompt;
    }
    if (params.n_gen.empty()) {
        params.n_gen = cmd_params_defaults.n_gen;
    }
    if (params.n_pg.empty()) {
        params.n_pg = cmd_params_defaults.n_pg;
    }
    if (params.n_batch.empty()) {
        params.n_batch = cmd_params_defaults.n_batch;
    }
    if (params.n_ubatch.empty()) {
        params.n_ubatch = cmd_params_defaults.n_ubatch;
    }
    if (params.type_k.empty()) {
        params.type_k = cmd_params_defaults.type_k;
    }
    if (params.type_v.empty()) {
        params.type_v = cmd_params_defaults.type_v;
    }
    if (params.n_gpu_layers.empty()) {
        params.n_gpu_layers = cmd_params_defaults.n_gpu_layers;
    }
    if (params.rpc_servers.empty()) {
        params.rpc_servers = cmd_params_defaults.rpc_servers;
    }
    if (params.split_mode.empty()) {
        params.split_mode = cmd_params_defaults.split_mode;
    }
    if (params.main_gpu.empty()) {
        params.main_gpu = cmd_params_defaults.main_gpu;
    }
    if (params.no_kv_offload.empty()) {
        params.no_kv_offload = cmd_params_defaults.no_kv_offload;
    }
    if (params.flash_attn.empty()) {
        params.flash_attn = cmd_params_defaults.flash_attn;
    }
    if (params.tensor_split.empty()) {
        params.tensor_split = cmd_params_defaults.tensor_split;
    }
    if (params.use_mmap.empty()) {
        params.use_mmap = cmd_params_defaults.use_mmap;
    }
    if (params.embeddings.empty()) {
        params.embeddings = cmd_params_defaults.embeddings;
    }
    if (params.n_threads.empty()) {
        params.n_threads = cmd_params_defaults.n_threads;
    }
    if (params.cpu_mask.empty()) {
        params.cpu_mask = cmd_params_defaults.cpu_mask;
    }
    if (params.cpu_strict.empty()) {
        params.cpu_strict = cmd_params_defaults.cpu_strict;
    }
    if (params.poll.empty()) {
        params.poll = cmd_params_defaults.poll;
    }

    return params;
}